

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_simd.h
# Opt level: O2

void __thiscall
embree::avx::
FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::FeatureAdaptiveEvalSimd
          (FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
           *this,HalfEdge *edge,char *vertices,size_t stride,vboolf_impl<4> *valid,vfloat_impl<4> *u
          ,vfloat_impl<4> *v,float *P,float *dPdu,float *dPdv,float *ddPdudu,float *ddPdvdv,
          float *ddPdudv,size_t dstride,size_t N)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  anon_union_32_2_4062524c_for_Vec2<embree::vfloat_impl<4>_>_1 local_1d20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1d00;
  undefined8 local_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 local_1cd0;
  undefined8 uStack_1cc8;
  
  this->P = P;
  this->dPdu = dPdu;
  this->dPdv = dPdv;
  this->ddPdudu = ddPdudu;
  this->ddPdvdv = ddPdvdv;
  this->ddPdudv = ddPdudv;
  this->dstride = dstride;
  this->N = N;
  if (edge->patch_type == REGULAR_QUAD_PATCH) {
    BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init
              ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_1d00,
               (EVP_PKEY_CTX *)edge);
    BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::
    eval<embree::vboolf_impl<4>,embree::vfloat_impl<4>>
              ((BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>> *)&local_1d00,valid,u,v
               ,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,1.0,dstride,N);
  }
  else if (edge->patch_type == BILINEAR_PATCH) {
    local_1d00._0_8_ = *(undefined8 *)(vertices + edge->vtx_index * stride);
    local_1d00._8_8_ = *(undefined8 *)(vertices + edge->vtx_index * stride + 8);
    lVar6 = (long)edge->next_half_edge_ofs;
    local_1cf0 = *(undefined8 *)(vertices + edge[lVar6].vtx_index * stride);
    uStack_1ce8 = *(undefined8 *)(vertices + edge[lVar6].vtx_index * stride + 8);
    lVar7 = (long)edge[lVar6].next_half_edge_ofs;
    local_1ce0 = *(undefined8 *)(vertices + edge[lVar6 + lVar7].vtx_index * stride);
    uStack_1cd8 = *(undefined8 *)(vertices + edge[lVar6 + lVar7].vtx_index * stride + 8);
    local_1cd0 = *(undefined8 *)
                  (vertices +
                  edge[lVar6 + lVar7 + edge[lVar6 + lVar7].next_half_edge_ofs].vtx_index * stride);
    uStack_1cc8 = *(undefined8 *)
                   (vertices +
                    edge[lVar6 + lVar7 + edge[lVar6 + lVar7].next_half_edge_ofs].vtx_index * stride
                   + 8);
    if (P != (float *)0x0) {
      for (sVar8 = 0; N != sVar8; sVar8 = sVar8 + 1) {
        fVar1 = *(float *)((long)&local_1d00 + sVar8 * 4);
        auVar12 = ZEXT416((uint)(*(float *)((long)&local_1cf0 + sVar8 * 4) - fVar1));
        auVar12 = vshufps_avx(auVar12,auVar12,0);
        auVar10._0_4_ = fVar1 + (u->field_0).v[0] * auVar12._0_4_;
        auVar10._4_4_ = fVar1 + (u->field_0).v[1] * auVar12._4_4_;
        auVar10._8_4_ = fVar1 + (u->field_0).v[2] * auVar12._8_4_;
        auVar10._12_4_ = fVar1 + (u->field_0).v[3] * auVar12._12_4_;
        fVar1 = *(float *)((long)&local_1cd0 + sVar8 * 4);
        auVar12 = ZEXT416((uint)(*(float *)((long)&local_1ce0 + sVar8 * 4) - fVar1));
        auVar12 = vshufps_avx(auVar12,auVar12,0);
        auVar13._0_4_ = fVar1 + (u->field_0).v[0] * auVar12._0_4_;
        auVar13._4_4_ = fVar1 + (u->field_0).v[1] * auVar12._4_4_;
        auVar13._8_4_ = fVar1 + (u->field_0).v[2] * auVar12._8_4_;
        auVar13._12_4_ = fVar1 + (u->field_0).v[3] * auVar12._12_4_;
        auVar12 = vsubps_avx(auVar13,auVar10);
        auVar9._0_4_ = auVar10._0_4_ + auVar12._0_4_ * (v->field_0).v[0];
        auVar9._4_4_ = auVar10._4_4_ + auVar12._4_4_ * (v->field_0).v[1];
        auVar9._8_4_ = auVar10._8_4_ + auVar12._8_4_ * (v->field_0).v[2];
        auVar9._12_4_ = auVar10._12_4_ + auVar12._12_4_ * (v->field_0).v[3];
        auVar12 = vmaskmovps_avx((undefined1  [16])valid->field_0,auVar9);
        *(undefined1 (*) [16])P = auVar12;
        P = (float *)(*(undefined1 (*) [16])P + dstride * 4);
      }
    }
    if (dPdu != (float *)0x0) {
      for (sVar8 = 0; N != sVar8; sVar8 = sVar8 + 1) {
        fVar1 = *(float *)((long)&local_1d00 + sVar8 * 4);
        fVar2 = *(float *)((long)&local_1cf0 + sVar8 * 4);
        fVar5 = fVar2 - fVar1;
        auVar12 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
        fVar3 = *(float *)((long)&local_1ce0 + sVar8 * 4);
        fVar4 = *(float *)((long)&local_1cd0 + sVar8 * 4);
        auVar10 = ZEXT416((uint)((fVar3 - fVar4) - fVar5));
        auVar10 = vshufps_avx(auVar10,auVar10,0);
        auVar14._0_4_ = auVar12._0_4_ + auVar10._0_4_ * (v->field_0).v[0];
        auVar14._4_4_ = auVar12._4_4_ + auVar10._4_4_ * (v->field_0).v[1];
        auVar14._8_4_ = auVar12._8_4_ + auVar10._8_4_ * (v->field_0).v[2];
        auVar14._12_4_ = auVar12._12_4_ + auVar10._12_4_ * (v->field_0).v[3];
        auVar12 = vmaskmovps_avx((undefined1  [16])valid->field_0,auVar14);
        *(undefined1 (*) [16])dPdu = auVar12;
        fVar4 = fVar4 - fVar1;
        auVar12 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
        auVar10 = ZEXT416((uint)((fVar3 - fVar2) - fVar4));
        auVar10 = vshufps_avx(auVar10,auVar10,0);
        auVar11._0_4_ = auVar12._0_4_ + auVar10._0_4_ * (u->field_0).v[0];
        auVar11._4_4_ = auVar12._4_4_ + auVar10._4_4_ * (u->field_0).v[1];
        auVar11._8_4_ = auVar12._8_4_ + auVar10._8_4_ * (u->field_0).v[2];
        auVar11._12_4_ = auVar12._12_4_ + auVar10._12_4_ * (u->field_0).v[3];
        auVar12 = vmaskmovps_avx((undefined1  [16])valid->field_0,auVar11);
        *(undefined1 (*) [16])dPdv = auVar12;
        dPdv = (float *)(*(undefined1 (*) [16])dPdv + dstride * 4);
        dPdu = (float *)(*(undefined1 (*) [16])dPdu + dstride * 4);
      }
    }
    if (ddPdudu != (float *)0x0) {
      lVar6 = dstride * 4;
      for (sVar8 = 0; N != sVar8; sVar8 = sVar8 + 1) {
        auVar12 = vmaskmovps_avx((undefined1  [16])valid->field_0,ZEXT816(0) << 0x40);
        *(undefined1 (*) [16])ddPdudu = auVar12;
        auVar12 = vmaskmovps_avx((undefined1  [16])valid->field_0,ZEXT816(0) << 0x40);
        *(undefined1 (*) [16])ddPdvdv = auVar12;
        auVar12 = ZEXT416((uint)((*(float *)((long)&local_1ce0 + sVar8 * 4) -
                                 *(float *)((long)&local_1cd0 + sVar8 * 4)) -
                                (*(float *)((long)&local_1cf0 + sVar8 * 4) -
                                *(float *)((long)&local_1d00 + sVar8 * 4))));
        auVar12 = vshufps_avx(auVar12,auVar12,0);
        auVar12 = vmaskmovps_avx((undefined1  [16])valid->field_0,auVar12);
        *(undefined1 (*) [16])ddPdudv = auVar12;
        ddPdudv = (float *)(*(undefined1 (*) [16])ddPdudv + lVar6);
        ddPdvdv = (float *)(*(undefined1 (*) [16])ddPdvdv + lVar6);
        ddPdudu = (float *)(*(undefined1 (*) [16])ddPdudu + lVar6);
      }
    }
  }
  else {
    GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::
    GeneralCatmullClarkPatchT
              ((GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)
               &local_1d00,edge,vertices,stride);
    local_1d20._0_8_ = *(undefined8 *)&u->field_0;
    local_1d20._8_8_ = *(undefined8 *)((long)&u->field_0 + 8);
    local_1d20._16_8_ = *(undefined8 *)&v->field_0;
    local_1d20._24_8_ = *(undefined8 *)((long)&v->field_0 + 8);
    eval_direct(this,valid,(GeneralCatmullClarkPatch *)&local_1d00,
                (Vec2<embree::vfloat_impl<4>_> *)&local_1d20.field_0,0);
    GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::
    ~GeneralCatmullClarkPatchT
              ((GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)
               &local_1d00);
  }
  return;
}

Assistant:

FeatureAdaptiveEvalSimd (const HalfEdge* edge, const char* vertices, size_t stride, const vbool& valid, const vfloat& u, const vfloat& v, 
                                 float* P, float* dPdu, float* dPdv, float* ddPdudu, float* ddPdvdv, float* ddPdudv, const size_t dstride, const size_t N)
        : P(P), dPdu(dPdu), dPdv(dPdv), ddPdudu(ddPdudu), ddPdvdv(ddPdvdv), ddPdudv(ddPdudv), dstride(dstride), N(N)
        {
          switch (edge->patch_type) {
          case HalfEdge::BILINEAR_PATCH: BilinearPatch(edge,vertices,stride).eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,1.0f,dstride,N); break;
          case HalfEdge::REGULAR_QUAD_PATCH: RegularPatchT(edge,vertices,stride).eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,1.0f,dstride,N); break;
#if PATCH_USE_GREGORY == 2
          case HalfEdge::IRREGULAR_QUAD_PATCH: GregoryPatchT<Vertex,Vertex_t>(edge,vertices,stride).eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,1.0f,dstride,N); break;
#endif
          default: {
            GeneralCatmullClarkPatch patch(edge,vertices,stride);
            eval_direct(valid,patch,Vec2<vfloat>(u,v),0);
            break;
          }
          }
        }